

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *node;
  TokenList *args_4;
  DataDeclarationSyntax *pDVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000078;
  TokenList *in_stack_00000080;
  BumpAllocator *in_stack_00000108;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_stack_00000110;
  TokenList *args_1;
  
  args_1 = (TokenList *)__child_stack;
  node = deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000070,in_stack_00000068);
  args_4 = deepClone(in_stack_00000080,in_stack_00000078);
  not_null<slang::syntax::DataTypeSyntax_*>::operator*
            ((not_null<slang::syntax::DataTypeSyntax_*> *)0x8178b8);
  deepClone<slang::syntax::DataTypeSyntax>((DataTypeSyntax *)node,(BumpAllocator *)__child_stack);
  deepClone<slang::syntax::DeclaratorSyntax>(in_stack_00000110,in_stack_00000108);
  TVar2 = parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DataDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::TokenList&,slang::syntax::DataTypeSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token>
                     (unaff_retaddr,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
                      args_1,(DataTypeSyntax *)TVar2.info,TVar2._0_8_,(Token *)args_4);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DataDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DataDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone(node.modifiers, alloc),
        *deepClone<DataTypeSyntax>(*node.type, alloc),
        *deepClone(node.declarators, alloc),
        node.semi.deepClone(alloc)
    );
}